

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Gia_Man_t *
Acb_NtkToGia(Acb_Ntk_t *p,Vec_Int_t *vSupp,Vec_Int_t *vNodes,Vec_Int_t *vRoots,Vec_Int_t *vDivs,
            Vec_Int_t *vTargets)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  size_t sVar7;
  char *__dest;
  int *piVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *vTemp;
  Gia_Man_t *pGVar10;
  long lVar11;
  long lVar12;
  
  p_00 = Gia_ManStart((p->vObjType).nSize * 2 + 0x3e6);
  pcVar6 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  if (pcVar6 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar6);
    __dest = (char *)malloc(sVar7 + 1);
    strcpy(__dest,pcVar6);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  uVar1 = (p->vObjType).nCap;
  if ((p->vObjCopy).nCap < (int)uVar1) {
    piVar8 = (p->vObjCopy).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar1 << 2);
    }
    (p->vObjCopy).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vObjCopy).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vObjCopy).pArray,0xff,(ulong)uVar1 * 4);
  }
  (p->vObjCopy).nSize = uVar1;
  if (0 < vSupp->nSize) {
    lVar11 = 0;
    do {
      iVar5 = vSupp->pArray[lVar11];
      if (((long)iVar5 < 0) || ((p->vCis).nSize <= iVar5)) goto LAB_0039408b;
      uVar1 = (p->vCis).pArray[iVar5];
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar3 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar4 = p_00->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_003940aa;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_003940aa;
      if ((int)uVar1 < 1) goto LAB_003940d2;
      uVar2 = (p->vObjCopy).nSize;
      if ((int)uVar2 < 1) goto LAB_003940c9;
      if (uVar2 <= uVar1) goto LAB_0039408b;
      piVar8 = (p->vObjCopy).pArray;
      if (piVar8[uVar1] != -1) goto LAB_003940f1;
      piVar8[uVar1] = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
      lVar11 = lVar11 + 1;
    } while (lVar11 < vSupp->nSize);
  }
  if ((vTargets != (Vec_Int_t *)0x0) && (0 < vTargets->nSize)) {
    lVar11 = 0;
    do {
      uVar1 = vTargets->pArray[lVar11];
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar3 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar4 = p_00->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) {
LAB_003940aa:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_003940aa;
      if ((int)uVar1 < 1) goto LAB_003940d2;
      uVar2 = (p->vObjCopy).nSize;
      if ((int)uVar2 < 1) goto LAB_003940c9;
      if (uVar2 <= uVar1) goto LAB_0039408b;
      piVar8 = (p->vObjCopy).pArray;
      if (piVar8[uVar1] != -1) goto LAB_003940f1;
      piVar8[uVar1] = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
      lVar11 = lVar11 + 1;
    } while (lVar11 < vTargets->nSize);
  }
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nCap = 0x10;
  vTemp->nSize = 0;
  piVar8 = (int *)malloc(0x40);
  vTemp->pArray = piVar8;
  iVar5 = vNodes->nSize;
  if (0 < iVar5) {
    lVar11 = 0;
    do {
      uVar1 = vNodes->pArray[lVar11];
      lVar12 = (long)(int)uVar1;
      if (lVar12 < 1) goto LAB_003940d2;
      uVar2 = (p->vObjCopy).nSize;
      if ((int)uVar2 < 1) goto LAB_003940c9;
      if (uVar2 <= uVar1) goto LAB_0039408b;
      if ((p->vObjCopy).pArray[lVar12] == -1) {
        iVar5 = Acb_ObjToGia(p_00,p,uVar1,vTemp);
        uVar2 = (p->vObjCopy).nSize;
        if ((int)uVar2 < 1) goto LAB_003940c9;
        if (uVar2 <= uVar1) goto LAB_0039408b;
        piVar8 = (p->vObjCopy).pArray;
        if (piVar8[lVar12] != -1) {
LAB_003940f1:
          __assert_fail("Acb_ObjCopy(p, i) == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x11a,"void Acb_ObjSetCopy(Acb_Ntk_t *, int, int)");
        }
        piVar8[lVar12] = iVar5;
        iVar5 = vNodes->nSize;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar5);
    piVar8 = vTemp->pArray;
  }
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  free(vTemp);
  if (0 < vRoots->nSize) {
    lVar11 = 0;
    do {
      iVar5 = vRoots->pArray[lVar11];
      if (((long)iVar5 < 0) || ((p->vCos).nSize <= iVar5)) goto LAB_0039408b;
      iVar5 = (p->vCos).pArray[iVar5];
      if ((long)iVar5 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p->vObjFans).nSize <= iVar5) goto LAB_0039408b;
      iVar5 = (p->vObjFans).pArray[iVar5];
      if (((long)iVar5 < 0) || ((p->vFanSto).nSize <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      uVar1 = (p->vFanSto).pArray[(long)iVar5 + 1];
      if ((long)(int)uVar1 < 1) goto LAB_003940d2;
      uVar2 = (p->vObjCopy).nSize;
      if ((int)uVar2 < 1) goto LAB_003940c9;
      if (uVar2 <= uVar1) goto LAB_0039408b;
      Gia_ManAppendCo(p_00,(p->vObjCopy).pArray[(int)uVar1]);
      lVar11 = lVar11 + 1;
    } while (lVar11 < vRoots->nSize);
  }
  if ((vDivs != (Vec_Int_t *)0x0) && (0 < vDivs->nSize)) {
    lVar11 = 0;
    do {
      uVar1 = vDivs->pArray[lVar11];
      if ((long)(int)uVar1 < 1) goto LAB_003940d2;
      uVar2 = (p->vObjCopy).nSize;
      if ((int)uVar2 < 1) goto LAB_003940c9;
      if (uVar2 <= uVar1) {
LAB_0039408b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Gia_ManAppendCo(p_00,(p->vObjCopy).pArray[(int)uVar1]);
      lVar11 = lVar11 + 1;
    } while (lVar11 < vDivs->nSize);
  }
  Gia_ManHashStop(p_00);
  pGVar10 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar10;
LAB_003940d2:
  pcVar6 = "i>0";
  goto LAB_003940d9;
LAB_003940c9:
  pcVar6 = "Acb_NtkHasObjCopies(p)";
LAB_003940d9:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
}

Assistant:

Gia_Man_t * Acb_NtkToGia( Acb_Ntk_t * p, Vec_Int_t * vSupp, Vec_Int_t * vNodes, Vec_Int_t * vRoots, Vec_Int_t * vDivs, Vec_Int_t * vTargets )
{
    Gia_Man_t * pNew, * pOne;
    Vec_Int_t * vFanins;
    int i, iObj;
    pNew = Gia_ManStart( 2 * Acb_NtkObjNum(p) + 1000 );
    pNew->pName = Abc_UtilStrsav(Acb_NtkName(p));
    Gia_ManHashAlloc( pNew );
    Acb_NtkCleanObjCopies( p );
    // create primary inputs
    Acb_NtkForEachCiVec( vSupp, p, iObj, i )
        Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    // add targets as primary inputs
    if ( vTargets )
        Vec_IntForEachEntry( vTargets, iObj, i )
            Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    // bit-blast internal nodes
    vFanins = Vec_IntAlloc( 4 );
    Vec_IntForEachEntry( vNodes, iObj, i )
        if ( Acb_ObjCopy(p, iObj) == -1 ) // skip targets assigned above
            Acb_ObjSetCopy( p, iObj, Acb_ObjToGia(pNew, p, iObj, vFanins) );
    Vec_IntFree( vFanins );
    // create primary outputs
    Acb_NtkForEachCoDriverVec( vRoots, p, iObj, i )
        Gia_ManAppendCo( pNew, Acb_ObjCopy(p, iObj) );
    // add divisor as primary outputs (if the divisors are not primary inputs)
    if ( vDivs )//&& Vec_IntSize(vDivs) > Vec_IntSize(vSupp) ) 
        Vec_IntForEachEntry( vDivs, iObj, i )
            Gia_ManAppendCo( pNew, Acb_ObjCopy(p, iObj) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}